

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O0

void __thiscall
cs::instance_type::check_define_var(instance_type *this,iterator it,bool regist,bool constant)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  signal_types sVar4;
  token_base **pptVar5;
  undefined8 uVar6;
  var_id *this_00;
  string *str;
  byte in_CL;
  byte bVar7;
  byte in_DL;
  iterator in_RDI;
  token_base *right_1;
  token_base *right;
  token_base *left;
  token_base *root;
  tree_type<cs::token_base_*> *t;
  iterator __end2;
  iterator __begin2;
  deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
  *__range2;
  deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
  *parallel_list;
  _Self *in_stack_fffffffffffffd98;
  internal_error *in_stack_fffffffffffffda0;
  runtime_error *this_01;
  undefined4 in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde4;
  iterator *in_stack_fffffffffffffde8;
  string *in_stack_fffffffffffffe08;
  domain_manager *in_stack_fffffffffffffe10;
  allocator *paVar8;
  undefined1 local_1d9 [33];
  tree_node *local_1b8;
  undefined1 local_1aa;
  allocator local_1a9;
  string local_1a8 [32];
  tree_node *local_188;
  token_base *local_180;
  undefined1 local_172;
  allocator local_171;
  string local_170 [7];
  undefined1 in_stack_fffffffffffffe97;
  instance_type *in_stack_fffffffffffffe98;
  iterator in_stack_fffffffffffffea0;
  allocator local_149;
  string local_148 [32];
  tree_node *local_128;
  token_base *local_120;
  tree_node *local_118;
  token_id *local_110;
  undefined1 local_102;
  allocator local_101;
  string local_100 [38];
  undefined1 local_da;
  allocator local_d9;
  string local_d8 [32];
  token_signal *local_b8;
  tree_node *local_b0;
  reference local_a8;
  _Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
  local_80;
  deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
  *local_60;
  deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
  *local_58;
  undefined1 local_4d;
  allocator local_39;
  string local_38 [30];
  undefined1 in_stack_ffffffffffffffe6;
  undefined1 in_stack_ffffffffffffffe7;
  undefined6 in_stack_ffffffffffffffe8;
  
  bVar7 = in_DL & 1;
  bVar1 = in_CL & 1;
  pptVar5 = tree_type<cs::token_base_*>::iterator::data
                      ((iterator *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
  if (*pptVar5 == (token_base *)0x0) {
    local_4d = 1;
    uVar6 = __cxa_allocate_exception(0x28);
    paVar8 = &local_39;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"Null pointer accessed.",paVar8);
    internal_error::internal_error(in_stack_fffffffffffffda0,(string *)in_stack_fffffffffffffd98);
    local_4d = 0;
    __cxa_throw(uVar6,&internal_error::typeinfo,internal_error::~internal_error);
  }
  pptVar5 = tree_type<cs::token_base_*>::iterator::data
                      ((iterator *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
  iVar3 = (*(*pptVar5)->_vptr_token_base[2])();
  if (iVar3 == 0xf) {
    pptVar5 = tree_type<cs::token_base_*>::iterator::data
                        ((iterator *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
    local_60 = token_parallel::get_parallel((token_parallel *)*pptVar5);
    local_58 = local_60;
    std::deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>::
    begin((deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
           *)in_stack_fffffffffffffd98);
    std::deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>::
    end((deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_> *
        )in_stack_fffffffffffffd98);
    while (bVar2 = std::operator!=((_Self *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98),
          bVar2) {
      local_a8 = std::
                 _Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
                 ::operator*(&local_80);
      local_b0 = (tree_node *)
                 tree_type<cs::token_base_*>::root
                           ((tree_type<cs::token_base_*> *)in_stack_fffffffffffffd98);
      check_define_var((instance_type *)CONCAT17(bVar7,CONCAT16(bVar1,in_stack_ffffffffffffffe8)),
                       in_RDI,(bool)in_stack_ffffffffffffffe7,(bool)in_stack_ffffffffffffffe6);
      std::
      _Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
      ::operator++((_Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
                    *)in_stack_fffffffffffffda0);
    }
  }
  else {
    pptVar5 = tree_type<cs::token_base_*>::iterator::data
                        ((iterator *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
    local_b8 = (token_signal *)*pptVar5;
    if (local_b8 == (token_signal *)0x0) {
      local_da = 1;
      uVar6 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_d8,"Null pointer accessed.",&local_d9);
      internal_error::internal_error(in_stack_fffffffffffffda0,(string *)in_stack_fffffffffffffd98);
      local_da = 0;
      __cxa_throw(uVar6,&internal_error::typeinfo,internal_error::~internal_error);
    }
    iVar3 = (*(local_b8->super_token_base)._vptr_token_base[2])();
    if (iVar3 != 3) {
      local_102 = 1;
      uVar6 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_100,"Wrong grammar for variable definition(1).",&local_101)
      ;
      runtime_error::runtime_error
                ((runtime_error *)in_stack_fffffffffffffda0,(string *)in_stack_fffffffffffffd98);
      local_102 = 0;
      __cxa_throw(uVar6,&runtime_error::typeinfo,runtime_error::~runtime_error);
    }
    sVar4 = token_signal::get_signal(local_b8);
    if (sVar4 == asi_) {
      local_118 = (tree_node *)
                  tree_type<cs::token_base_*>::iterator::left(in_stack_fffffffffffffde8);
      pptVar5 = tree_type<cs::token_base_*>::iterator::data
                          ((iterator *)CONCAT44(sVar4,in_stack_fffffffffffffde0));
      local_110 = (token_id *)*pptVar5;
      local_128 = (tree_node *)
                  tree_type<cs::token_base_*>::iterator::right(in_stack_fffffffffffffde8);
      pptVar5 = tree_type<cs::token_base_*>::iterator::data
                          ((iterator *)CONCAT44(sVar4,in_stack_fffffffffffffde0));
      local_120 = *pptVar5;
      if (((local_110 == (token_id *)0x0) || (local_120 == (token_base *)0x0)) ||
         (iVar3 = (*(local_110->super_token_base)._vptr_token_base[2])(), iVar3 != 4)) {
        uVar6 = __cxa_allocate_exception(0x28);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_148,"Wrong grammar for variable definition(2).",&local_149);
        runtime_error::runtime_error
                  ((runtime_error *)in_stack_fffffffffffffda0,(string *)in_stack_fffffffffffffd98);
        __cxa_throw(uVar6,&runtime_error::typeinfo,runtime_error::~runtime_error);
      }
      if (((bVar1 & 1) != 0) && (iVar3 = (*local_120->_vptr_token_base[2])(), iVar3 != 7)) {
        local_172 = 1;
        uVar6 = __cxa_allocate_exception(0x28);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_170,"Wrong grammar for constant variable definition(3).",&local_171);
        runtime_error::runtime_error
                  ((runtime_error *)in_stack_fffffffffffffda0,(string *)in_stack_fffffffffffffd98);
        local_172 = 0;
        __cxa_throw(uVar6,&runtime_error::typeinfo,runtime_error::~runtime_error);
      }
      if ((bVar7 & 1) != 0) {
        this_00 = token_id::get_id(local_110);
        var_id::operator_cast_to_string_(this_00);
        domain_manager::add_record(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
      }
    }
    else {
      if (sVar4 != bind_) {
        str = (string *)__cxa_allocate_exception(0x28);
        this_01 = (runtime_error *)local_1d9;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)(local_1d9 + 1),"Wrong grammar for variable definition(5).",
                   (allocator *)this_01);
        runtime_error::runtime_error(this_01,str);
        __cxa_throw(str,&runtime_error::typeinfo,runtime_error::~runtime_error);
      }
      local_188 = (tree_node *)
                  tree_type<cs::token_base_*>::iterator::right(in_stack_fffffffffffffde8);
      pptVar5 = tree_type<cs::token_base_*>::iterator::data
                          ((iterator *)CONCAT44(sVar4,in_stack_fffffffffffffde0));
      local_180 = *pptVar5;
      if (((bVar1 & 1) != 0) &&
         ((local_180 == (token_base *)0x0 ||
          (iVar3 = (*local_180->_vptr_token_base[2])(), iVar3 != 7)))) {
        local_1aa = 1;
        uVar6 = __cxa_allocate_exception(0x28);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_1a8,"Wrong grammar for constant variable definition(4).",&local_1a9);
        runtime_error::runtime_error
                  ((runtime_error *)in_stack_fffffffffffffda0,(string *)in_stack_fffffffffffffd98);
        local_1aa = 0;
        __cxa_throw(uVar6,&runtime_error::typeinfo,runtime_error::~runtime_error);
      }
      local_1b8 = (tree_node *)
                  tree_type<cs::token_base_*>::iterator::left(in_stack_fffffffffffffde8);
      check_define_structured_binding
                (in_stack_fffffffffffffe98,in_stack_fffffffffffffea0,(bool)in_stack_fffffffffffffe97
                );
    }
  }
  return;
}

Assistant:

void instance_type::check_define_var(tree_type<token_base *>::iterator it, bool regist, bool constant)
	{
		if (it.data() == nullptr)
			throw internal_error("Null pointer accessed.");
		if (it.data()->get_type() == token_types::parallel) {
			auto &parallel_list = static_cast<token_parallel *>(it.data())->get_parallel();
			for (auto &t: parallel_list)
				check_define_var(t.root(), regist, constant);
		}
		else {
			token_base *root = it.data();
			if (root == nullptr)
				throw internal_error("Null pointer accessed.");
			if (root->get_type() != token_types::signal)
				throw runtime_error("Wrong grammar for variable definition(1).");
			switch (static_cast<token_signal *>(root)->get_signal()) {
			case signal_types::asi_: {
				token_base *left = it.left().data();
				token_base *right = it.right().data();
				if (left == nullptr || right == nullptr || left->get_type() != token_types::id)
					throw runtime_error("Wrong grammar for variable definition(2).");
				if (constant && right->get_type() != token_types::value)
					throw runtime_error("Wrong grammar for constant variable definition(3).");
				if (regist)
					storage.add_record(static_cast<token_id *>(left)->get_id());
				break;
			}
			case signal_types::bind_: {
				token_base *right = it.right().data();
				if (constant && (right == nullptr || right->get_type() != token_types::value))
					throw runtime_error("Wrong grammar for constant variable definition(4).");
				check_define_structured_binding(it.left(), regist);
				break;
			}
			default:
				throw runtime_error("Wrong grammar for variable definition(5).");
			}
		}
	}